

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O3

word atoh(char *s)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  word wVar6;
  uint uVar7;
  
  sVar2 = strlen(s);
  bVar4 = 0;
  if ((int)(uint)sVar2 < 1) {
    wVar6 = 0;
  }
  else {
    uVar3 = (ulong)((uint)sVar2 & 0x7fffffff);
    uVar7 = 0;
    do {
      cVar1 = s[uVar3 - 1];
      bVar5 = cVar1 - 0x30;
      if (9 < bVar5) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar5 = cVar1 - 0x37;
        }
        else {
          if (5 < (byte)(cVar1 + 0x9fU)) {
            printf("error: invalid hex code [%s] - defaulting to 0000\n",s);
            return 0;
          }
          bVar5 = cVar1 + 0xa9;
        }
      }
      uVar7 = uVar7 | (uint)bVar5 << (bVar4 & 0x1f);
      wVar6 = (word)uVar7;
      bVar4 = bVar4 + 4;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return wVar6;
}

Assistant:

word atoh(char *s) {
int i, sl=strlen(s);
byte x;
word r = 0;
  for(i=0;i<sl;i++) {
    x=s[(sl-1)-i];
    if(x>='0'&&x<='9')x-='0';
    else if(x>='A'&&x<='F')x-='A'-0x0a;
    else if(x>='a'&&x<='f')x-='a'-0x0a;
    else {
      printf("error: invalid hex code [%s] - defaulting to 0000\n", s);
      return 0;
    }
    r|=x<<(i<<2);
  }
  return r;
}